

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgenericitemmodel.cpp
# Opt level: O0

void QGenericItemModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  QGenericItemModel *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    (**(code **)(*in_RDI + 0x180))();
  }
  return;
}

Assistant:

void QGenericItemModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGenericItemModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->resetInternalData(); break;
        default: ;
        }
    }
    (void)_a;
}